

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O1

pair<ska::detailv3::sherwood_v3_table<std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_const_slang::syntax::SyntaxNode_*,_slang::Hasher<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::KeyOrValueHasher<const_slang::syntax::SyntaxNode_*,_std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::Hasher<const_slang::syntax::SyntaxNode_*>_>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::KeyOrValueEquality<const_slang::syntax::SyntaxNode_*,_std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_std::equal_to<const_slang::syntax::SyntaxNode_*>_>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>_>_>_>::templated_iterator<std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>_>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>,slang::syntax::SyntaxNode_const*,slang::Hasher<slang::syntax::SyntaxNode_const*>,ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxNode_const*,std::pair<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>,slang::Hasher<slang::syntax::SyntaxNode_const*>>,std::equal_to<slang::syntax::SyntaxNode_const*>,ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxNode_const*,std::pair<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>,std::equal_to<slang::syntax::SyntaxNode_const*>>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>>>>
::emplace<std::pair<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>>
          (sherwood_v3_table<std::pair<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>,slang::syntax::SyntaxNode_const*,slang::Hasher<slang::syntax::SyntaxNode_const*>,ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxNode_const*,std::pair<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>,slang::Hasher<slang::syntax::SyntaxNode_const*>>,std::equal_to<slang::syntax::SyntaxNode_const*>,ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxNode_const*,std::pair<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>,std::equal_to<slang::syntax::SyntaxNode_const*>>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>>>>
           *this,pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node> *key)

{
  EntryPointer psVar1;
  long lVar2;
  EntryPointer psVar3;
  char distance_from_desired;
  EntryPointer current_entry;
  pair<ska::detailv3::sherwood_v3_table<std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_const_slang::syntax::SyntaxNode_*,_slang::Hasher<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::KeyOrValueHasher<const_slang::syntax::SyntaxNode_*,_std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::Hasher<const_slang::syntax::SyntaxNode_*>_>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::KeyOrValueEquality<const_slang::syntax::SyntaxNode_*,_std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_std::equal_to<const_slang::syntax::SyntaxNode_*>_>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>_>_>_>::templated_iterator<std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>_>,_bool>
  pVar4;
  
  lVar2 = ((ulong)((long)key->first * -0x61c8864680b583eb) >> ((byte)this[0x10] & 0x3f)) * 0x20;
  current_entry = (EntryPointer)(*(long *)this + lVar2);
  if (*(char *)(*(long *)this + lVar2) < '\0') {
    distance_from_desired = '\0';
  }
  else {
    distance_from_desired = '\0';
    psVar3 = current_entry;
    do {
      if (key->first == (psVar3->field_1).value.first) {
        pVar4._8_8_ = 0;
        pVar4.first.current = psVar3;
        return pVar4;
      }
      current_entry = psVar3 + 1;
      distance_from_desired = distance_from_desired + '\x01';
      psVar1 = psVar3 + 1;
      psVar3 = current_entry;
    } while (distance_from_desired <= psVar1->distance_from_desired);
  }
  pVar4 = emplace_new_key<std::pair<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>>
                    (this,distance_from_desired,current_entry,key);
  return pVar4;
}

Assistant:

std::pair<iterator, bool> emplace(Key && key, Args &&... args)
    {
        size_t index = hash_policy.index_for_hash(hash_object(key), num_slots_minus_one);
        EntryPointer current_entry = entries + ptrdiff_t(index);
        int8_t distance_from_desired = 0;
        for (; current_entry->distance_from_desired >= distance_from_desired; ++current_entry, ++distance_from_desired)
        {
            if (compares_equal(key, current_entry->value))
                return { { current_entry }, false };
        }
        return emplace_new_key(distance_from_desired, current_entry, std::forward<Key>(key), std::forward<Args>(args)...);
    }